

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

uint64_t roaring_bitmap_and_cardinality(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  int iVar1;
  int iVar2;
  ushort uVar3;
  uint16_t uVar4;
  int iVar5;
  container_t *c2_00;
  roaring_array_t *in_RSI;
  roaring_array_t *in_RDI;
  container_t *c2;
  container_t *c1;
  uint8_t type2;
  uint8_t type1;
  uint16_t s2;
  uint16_t s1;
  int pos2;
  int pos1;
  uint64_t answer;
  int length2;
  int length1;
  int32_t in_stack_ffffffffffffffb8;
  ushort in_stack_ffffffffffffffbe;
  roaring_array_t *in_stack_ffffffffffffffc0;
  uint8_t local_2e;
  uint8_t local_2d;
  uint16_t local_2c;
  uint8_t type1_00;
  int iVar6;
  int iVar7;
  uint64_t local_20;
  
  iVar1 = in_RDI->size;
  iVar2 = in_RSI->size;
  local_20 = 0;
  iVar7 = 0;
  iVar6 = 0;
  while( true ) {
    uVar3 = in_stack_ffffffffffffffbe & 0xff;
    if (iVar7 < iVar1) {
      uVar3 = CONCAT11(iVar6 < iVar2,(char)in_stack_ffffffffffffffbe);
    }
    in_stack_ffffffffffffffbe = uVar3;
    if ((char)(in_stack_ffffffffffffffbe >> 8) == '\0') break;
    uVar4 = ra_get_key_at_index(in_RDI,(uint16_t)iVar7);
    local_2c = ra_get_key_at_index(in_RSI,(uint16_t)iVar6);
    if (uVar4 == local_2c) {
      c2_00 = ra_get_container_at_index(in_RDI,(uint16_t)iVar7,&local_2d);
      type1_00 = (uint8_t)(uVar4 >> 8);
      in_stack_ffffffffffffffc0 =
           (roaring_array_t *)ra_get_container_at_index(in_RSI,(uint16_t)iVar6,&local_2e);
      iVar5 = container_and_cardinality
                        ((container_t *)CONCAT44(iVar7,iVar6),type1_00,c2_00,
                         (uint8_t)((ulong)in_stack_ffffffffffffffc0 >> 0x38));
      local_20 = (long)iVar5 + local_20;
      iVar7 = iVar7 + 1;
      iVar6 = iVar6 + 1;
    }
    else if (uVar4 < local_2c) {
      iVar7 = ra_advance_until(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,
                               in_stack_ffffffffffffffb8);
    }
    else {
      iVar6 = ra_advance_until(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbe,
                               in_stack_ffffffffffffffb8);
    }
  }
  return local_20;
}

Assistant:

uint64_t roaring_bitmap_and_cardinality(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            answer += container_and_cardinality(c1, type1, c2, type2);
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}